

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::BackgroundMarkWeakRefs(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  ulong uVar6;
  HeapBlock *pHVar7;
  void *address;
  SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *pSVar8;
  Type pRVar9;
  Type TVar10;
  Iterator local_40;
  
  pSVar8 = &(this->weakReferenceRegionList).
            super_SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>;
  local_40.list = pSVar8;
  local_40.current = &pSVar8->super_SListNodeBase<Memory::HeapAllocator>;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    do {
      if (pSVar8 == (SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>
                     *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        pSVar8 = (SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *
                 )local_40.current;
      }
      local_40.current =
           (((SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)
            &pSVar8->super_SListNodeBase<Memory::HeapAllocator>)->
           super_SListNodeBase<Memory::HeapAllocator>).next;
      if ((SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)
          local_40.current == local_40.list) {
        return;
      }
      pTVar5 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
               Iterator::Data(&local_40);
      TVar10 = pTVar5->count;
      pSVar8 = (SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)
               local_40.current;
    } while (TVar10 == 0);
    pRVar9 = pTVar5->ptr + 8;
    do {
      address = *(void **)(pRVar9 + -8);
      if ((address != (void *)0x0) && (pHVar7 = *(HeapBlock **)pRVar9, ((ulong)pHVar7 & 1) == 0)) {
        if (pHVar7 == (HeapBlock *)0x0) {
          if (((ulong)address & 0xf) == 0 && (void *)0xffff < address) {
            pHVar7 = HeapBlockMap64::GetHeapBlock(&this->heapBlockMap,address);
            *(HeapBlock **)pRVar9 = pHVar7;
            if (pHVar7 == (HeapBlock *)0x0) goto LAB_007145f2;
            address = *(void **)(pRVar9 + -8);
            goto LAB_007145a8;
          }
          uVar6 = 0;
        }
        else {
LAB_007145a8:
          iVar3 = (*pHVar7->_vptr_HeapBlock[0xb])(pHVar7,address);
          if ((char)iVar3 == '\0') goto LAB_007145f2;
          uVar6 = *(ulong *)pRVar9 | 1;
        }
        *(ulong *)pRVar9 = uVar6;
      }
LAB_007145f2:
      pRVar9 = pRVar9 + 0x10;
      TVar10 = TVar10 - 1;
      pSVar8 = (SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)
               local_40.current;
    } while (TVar10 != 0);
  } while( true );
}

Assistant:

void
Recycler::BackgroundMarkWeakRefs()
{
#if ENABLE_WEAK_REFERENCE_REGIONS
    auto iterator = this->weakReferenceRegionList.GetIterator();
    while (iterator.Next())
    {
        RecyclerWeakReferenceRegion region = iterator.Data();
        RecyclerWeakReferenceRegionItem<void*> *items = region.GetPtr();
        size_t count = region.GetCount();
        for (size_t index = 0; index < count; ++index)
        {
            RecyclerWeakReferenceRegionItem<void*> &item = items[index];
            if (item.ptr == nullptr)
            {
                continue;
            }

            if (((uintptr_t)item.heapBlock & 0x1) == 0x1)
            {
                // This weak reference is already marked
                continue;
            }

            if (item.heapBlock == nullptr)
            {
                item.heapBlock = this->FindHeapBlock(item.ptr);
                if (item.heapBlock == nullptr)
                {
                    // This isn't a real weak reference, ignore it
                    continue;
                }
            }

            if (item.heapBlock->TestObjectMarkedBit(item.ptr))
            {
                item.heapBlock = (HeapBlock*) ((uintptr_t)item.heapBlock | 0x1);
            }
        }
    }
#endif
}